

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O1

void ssl_cf_destroy(Curl_cfilter *cf,Curl_easy *data)

{
  undefined8 uVar1;
  
  uVar1 = *(undefined8 *)((long)cf->ctx + 0x48);
  *(Curl_easy **)((long)cf->ctx + 0x48) = data;
  cf_close(cf,data);
  *(undefined8 *)((long)cf->ctx + 0x48) = uVar1;
  cf_ctx_free((ssl_connect_data *)cf->ctx);
  cf->ctx = (void *)0x0;
  return;
}

Assistant:

static void ssl_cf_destroy(struct Curl_cfilter *cf, struct Curl_easy *data)
{
  struct cf_call_data save;

  CF_DATA_SAVE(save, cf, data);
  cf_close(cf, data);
  CF_DATA_RESTORE(cf, save);
  cf_ctx_free(cf->ctx);
  cf->ctx = NULL;
}